

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_notation.cpp
# Opt level: O1

ScientificNotation __thiscall
icu_63::number::ScientificNotation::withMinExponentDigits
          (ScientificNotation *this,int32_t minExponentDigits)

{
  Notation NVar1;
  undefined4 local_10;
  uint uStack_c;
  UNumberSignDisplay UStack_8;
  
  if (minExponentDigits - 1U < 999) {
    UStack_8 = (this->super_Notation).fUnion.scientific.fExponentSignDisplay;
    local_10 = 0;
    uStack_c = minExponentDigits << 0x10 | (uint)*(ushort *)&(this->super_Notation).fUnion;
  }
  else {
    local_10 = 3;
    uStack_c = 0x10112;
  }
  NVar1.fUnion.compactStyle = uStack_c;
  NVar1.fType = local_10;
  NVar1.fUnion.scientific.fExponentSignDisplay = UStack_8;
  return (ScientificNotation)NVar1;
}

Assistant:

ScientificNotation
ScientificNotation::withMinExponentDigits(int32_t minExponentDigits) const {
    if (minExponentDigits >= 1 && minExponentDigits <= kMaxIntFracSig) {
        ScientificSettings settings = fUnion.scientific;
        settings.fMinExponentDigits = static_cast<digits_t>(minExponentDigits);
        NotationUnion union_ = {settings};
        return {NTN_SCIENTIFIC, union_};
    } else {
        return {U_NUMBER_ARG_OUTOFBOUNDS_ERROR};
    }
}